

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<int_const&>::captureExpression<(Catch::Internal::Operator)0,int>
          (ExpressionLhs<int_const&> *this,int *rhs)

{
  uint uVar1;
  undefined4 uVar2;
  int in_EDX;
  int value;
  allocator local_79;
  string local_78 [32];
  string local_58;
  string local_38;
  
  uVar1 = **(uint **)(this + 0x228);
  uVar2 = 0x11;
  if (uVar1 == *rhs) {
    uVar2 = 0;
  }
  *(undefined4 *)(this + 0x40) = uVar2;
  toString_abi_cxx11_(&local_38,(Catch *)(ulong)uVar1,in_EDX);
  std::__cxx11::string::_M_assign((string *)(this + 0x50));
  toString_abi_cxx11_(&local_58,(Catch *)(ulong)(uint)*rhs,value);
  std::__cxx11::string::_M_assign((string *)(this + 0x70));
  std::__cxx11::string::string(local_78,"==",&local_79);
  std::__cxx11::string::_M_assign((string *)(this + 0x90));
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (ExpressionResultBuilder *)this;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }